

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 IVar1;
  ImRect IVar2;
  
  switch(rect_type) {
  case 0:
    IVar2 = ImGuiWindow::Rect(window);
    return IVar2;
  case 1:
    return window->OuterRectClipped;
  case 2:
    return window->InnerRect;
  case 3:
    return window->InnerClipRect;
  case 4:
    return window->WorkRect;
  case 5:
    IVar1 = (window->InnerRect).Min;
    IVar2.Min.x = (IVar1.x - (window->Scroll).x) + (window->WindowPadding).x;
    IVar2.Min.y = (IVar1.y - (window->Scroll).y) + (window->WindowPadding).y;
    IVar2.Max.x = (window->ContentSize).x + IVar2.Min.x;
    IVar2.Max.y = (window->ContentSize).y + IVar2.Min.y;
    return IVar2;
  case 6:
    return window->ContentRegionRect;
  default:
    return (ImRect)ZEXT816(0);
  }
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }